

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_ManHasDangling(Gia_Man_t *p)

{
  byte *pbVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  ulong uVar9;
  
  uVar5 = p->nObjs;
  if ((0 < (int)uVar5) && (pGVar6 = p->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
    lVar4 = 0;
    do {
      uVar2 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar2 & 0xffffffffbfffffff;
      uVar9 = uVar2 & 0x1fffffff;
      if (uVar9 == 0x1fffffff || -1 < (int)uVar2) {
        pGVar7 = p->pObjs;
        if ((pGVar6 < pGVar7) || (pGVar7 + p->nObjs <= pGVar6)) {
LAB_0078916c:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if ((p->pMuxes != (uint *)0x0) &&
           (p->pMuxes[(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * -0x55555555] != 0)) {
          pGVar6[-uVar9].field_0x3 = pGVar6[-uVar9].field_0x3 | 0x40;
          *(ulong *)(pGVar6 + -(ulong)(*(uint *)&pGVar6->field_0x4 & 0x1fffffff)) =
               *(ulong *)(pGVar6 + -(ulong)(*(uint *)&pGVar6->field_0x4 & 0x1fffffff)) | 0x40000000;
          pGVar7 = p->pObjs;
          if ((pGVar6 < pGVar7) || (pGVar7 + p->nObjs <= pGVar6)) goto LAB_0078916c;
          if ((int)p->pMuxes[(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * -0x55555555] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          uVar5 = p->pMuxes[(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * -0x55555555] >> 1;
          if (p->nObjs <= (int)uVar5) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar7 = pGVar7 + uVar5;
          goto LAB_007890cc;
        }
        if (-1 < (int)uVar2 && (int)uVar9 != 0x1fffffff) {
          pGVar6[-uVar9].field_0x3 = pGVar6[-uVar9].field_0x3 | 0x40;
          uVar9 = (ulong)(*(uint *)&pGVar6->field_0x4 & 0x1fffffff);
          goto LAB_007890c1;
        }
      }
      else {
LAB_007890c1:
        pGVar7 = pGVar6 + -uVar9;
LAB_007890cc:
        pGVar7->field_0x3 = pGVar7->field_0x3 | 0x40;
      }
      lVar4 = lVar4 + 1;
      uVar5 = p->nObjs;
    } while ((lVar4 < (int)uVar5) && (pGVar6 = p->pObjs + lVar4, p->pObjs != (Gia_Obj_t *)0x0));
  }
  if ((int)uVar5 < 1) {
LAB_00789142:
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_00789142;
      uVar2 = *(ulong *)(&p->pObjs->field_0x0 + lVar4);
      iVar3 = iVar3 + (uint)((uVar2 & 0xc0000000) == 0 && (~(uint)uVar2 & 0x1fffffff) != 0);
      lVar4 = lVar4 + 0xc;
    } while ((ulong)uVar5 * 0xc != lVar4);
  }
  if (0 < (int)uVar5) {
    lVar4 = 0;
    lVar8 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return iVar3;
      }
      pbVar1 = &p->pObjs->field_0x3 + lVar4;
      *pbVar1 = *pbVar1 & 0xbf;
      lVar8 = lVar8 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar8 < p->nObjs);
  }
  return iVar3;
}

Assistant:

int Gia_ManHasDangling( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
        else if ( Gia_ObjIsMux(p, pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
            Gia_ObjFanin2(p, pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
    }
    Gia_ManForEachAnd( p, pObj, i )
        Counter += !pObj->fMark0;
    Gia_ManCleanMark0( p );
    return Counter;
}